

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectPtr *o_00;
  SQChar *pSVar3;
  SQObjectPtr oval;
  SQObjectPtr local_30;
  
  if (idx < 0) {
    o_00 = SQVM::GetUp(v,idx);
  }
  else {
    o_00 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  *o = o_00;
  SVar2 = (o_00->super_SQObject)._type;
  if (SVar2 != type) {
    local_30.super_SQObject._unVal.pString = SQVM::PrintObjVal(v,o_00);
    local_30.super_SQObject._type = OT_STRING;
    pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    pSVar3 = IdType2Name(type);
    SQVM::Raise_Error(v,"wrong argument type, expected \'%s\' got \'%.50s\'",pSVar3,
                      &(local_30.super_SQObject._unVal.pTable)->_firstfree);
    SQObjectPtr::~SQObjectPtr(&local_30);
  }
  return SVar2 == type;
}

Assistant:

static bool sq_aux_gettypedarg(HSQUIRRELVM v,SQInteger idx,SQObjectType type,SQObjectPtr **o)
{
    *o = &stack_get(v,idx);
    if(type(**o) != type){
        SQObjectPtr oval = v->PrintObjVal(**o);
        v->Raise_Error(_SC("wrong argument type, expected '%s' got '%.50s'"),IdType2Name(type),_stringval(oval));
        return false;
    }
    return true;
}